

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

void __thiscall
sjtu::DynamicFileManager<sjtu::trainType>::save
          (DynamicFileManager<sjtu::trainType> *this,locType *offset)

{
  LRUCache<sjtu::trainType>::dirty_page_set
            ((this->super_FileManager_Base<sjtu::trainType>).cache,offset);
  return;
}

Assistant:

virtual void save(const locType &offset) override {cache -> dirty_page_set(offset);}